

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O0

uint32_t helper_bfins_mem_m68k
                   (CPUM68KState_conflict *env,uint32_t addr,uint32_t val,int32_t ofs,uint32_t len)

{
  char cVar1;
  uint64_t uVar2;
  bf_data bVar3;
  uintptr_t unaff_retaddr;
  uint64_t mask;
  uint64_t data;
  bf_data d;
  uintptr_t ra;
  uint32_t len_local;
  int32_t ofs_local;
  uint32_t val_local;
  uint32_t addr_local;
  CPUM68KState_conflict *env_local;
  
  bVar3 = bf_prep(addr,ofs,len);
  data._0_4_ = bVar3.addr;
  d.addr = bVar3.blen;
  uVar2 = bf_load(env,(uint32_t)data,d.addr,unaff_retaddr);
  cVar1 = (char)bVar3.len;
  bf_store(env,(uint32_t)data,d.addr,
           uVar2 & ((ulong)(-1L << (0x40U - cVar1 & 0x3f)) >> ((byte)bVar3.bofs & 0x3f) ^
                   0xffffffffffffffff) |
           ((ulong)val << (0x40U - cVar1 & 0x3f)) >> ((byte)bVar3.bofs & 0x3f),unaff_retaddr);
  return val << (0x20U - cVar1 & 0x1f);
}

Assistant:

uint32_t HELPER(bfins_mem)(CPUM68KState *env, uint32_t addr, uint32_t val,
                           int32_t ofs, uint32_t len)
{
    uintptr_t ra = GETPC();
    struct bf_data d = bf_prep(addr, ofs, len);
    uint64_t data = bf_load(env, d.addr, d.blen, ra);
#ifdef _MSC_VER
    uint64_t mask = 0xffffffffffffffffULL << (64 - d.len) >> d.bofs;
#else
    uint64_t mask = -1ull << (64 - d.len) >> d.bofs;
#endif

    data = (data & ~mask) | (((uint64_t)val << (64 - d.len)) >> d.bofs);

    bf_store(env, d.addr, d.blen, data, ra);

    /* The field at the top of the word is also CC_N for CC_OP_LOGIC.  */
    return val << (32 - d.len);
}